

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lecturedemomesh.cc
# Opt level: O0

void lecturedemo::scanTopology(Mesh *mesh,dim_t codim)

{
  Entity *entity;
  bool bVar1;
  uint uVar2;
  int iVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  reference ppEVar5;
  undefined4 extraout_var_00;
  Entity *subent;
  iterator __end3;
  iterator __begin3;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *__range3;
  undefined1 auStack_2e8 [4];
  size_type sub_cnt;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> sub_ent_range;
  dim_t sub_codim;
  glb_idx_t ent_idx;
  RefEl ref_el;
  Entity *ent;
  iterator __end1;
  iterator __begin1;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *__range1;
  string local_290;
  allocator<char> local_269;
  string local_268;
  allocator<char> local_241;
  string local_240;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [380];
  uint local_14;
  Mesh *pMStack_10;
  dim_t codim_local;
  Mesh *mesh_local;
  
  local_14 = codim;
  pMStack_10 = mesh;
  uVar2 = (**mesh->_vptr_Mesh)();
  if (uVar2 < codim) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    poVar4 = std::operator<<(local_190,"codim ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_14);
    std::operator<<(poVar4," too large");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,"(codim <= mesh.DimMesh())",&local_1d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/examples/lecturedemos/lecturedemomesh.cc"
               ,&local_1f9);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_1d0,&local_1f8,0x41,&local_220);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::allocator<char>::~allocator(&local_1f9);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::allocator<char>::~allocator(&local_1d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,"false",&local_241);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_268,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/examples/lecturedemos/lecturedemomesh.cc"
               ,&local_269);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_290,"",(allocator<char> *)((long)&__range1 + 7));
    lf::base::AssertionFailed(&local_240,&local_268,0x41,&local_290);
    std::__cxx11::string::~string((string *)&local_290);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
    std::__cxx11::string::~string((string *)&local_268);
    std::allocator<char>::~allocator(&local_269);
    std::__cxx11::string::~string((string *)&local_240);
    std::allocator<char>::~allocator(&local_241);
    abort();
  }
  iVar3 = (*pMStack_10->_vptr_Mesh[2])(pMStack_10,(ulong)local_14);
  __begin1._M_current = (Entity **)CONCAT44(extraout_var,iVar3);
  __end1 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                     ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin1);
  ent = (Entity *)
        std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                  ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin1);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                      (&__end1,(__normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                                *)&ent);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppEVar5 = __gnu_cxx::
              __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
              ::operator*(&__end1);
    _ent_idx = *ppEVar5;
    iVar3 = (*_ent_idx->_vptr_Entity[4])();
    sub_codim._3_1_ = (undefined1)iVar3;
    uVar2 = (*pMStack_10->_vptr_Mesh[5])(pMStack_10,_ent_idx);
    poVar4 = lf::base::operator<<((ostream *)&std::cout,(RefEl *)((long)&sub_codim + 3));
    poVar4 = std::operator<<(poVar4,": idx = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar2);
    std::operator<<(poVar4,'\n');
    sub_ent_range._M_extent._M_extent_value._4_4_ = 1;
    while( true ) {
      uVar2 = sub_ent_range._M_extent._M_extent_value._4_4_;
      iVar3 = (**pMStack_10->_vptr_Mesh)();
      if (iVar3 - local_14 < uVar2) break;
      iVar3 = (*_ent_idx->_vptr_Entity[1])
                        (_ent_idx,(ulong)sub_ent_range._M_extent._M_extent_value._4_4_);
      _auStack_2e8 = (pointer)CONCAT44(extraout_var_00,iVar3);
      __range3._4_4_ = 0;
      __end3 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                         ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)auStack_2e8
                         );
      subent = (Entity *)
               std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                         ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)auStack_2e8
                         );
      while( true ) {
        bVar1 = __gnu_cxx::
                operator==<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                          (&__end3,(__normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                                    *)&subent);
        if (((bVar1 ^ 0xffU) & 1) == 0) break;
        ppEVar5 = __gnu_cxx::
                  __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                  ::operator*(&__end3);
        entity = *ppEVar5;
        poVar4 = std::operator<<((ostream *)&std::cout,"\t rel. codim ");
        poVar4 = (ostream *)
                 std::ostream::operator<<(poVar4,sub_ent_range._M_extent._M_extent_value._4_4_);
        poVar4 = std::operator<<(poVar4," sub-ent ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,__range3._4_4_);
        poVar4 = std::operator<<(poVar4,": ");
        poVar4 = lf::mesh::operator<<(poVar4,entity);
        poVar4 = std::operator<<(poVar4,", idx = ");
        uVar2 = (*pMStack_10->_vptr_Mesh[5])(pMStack_10,entity);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar2);
        std::operator<<(poVar4,'\n');
        __range3._4_4_ = __range3._4_4_ + 1;
        __gnu_cxx::
        __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
        ::operator++(&__end3);
      }
      sub_ent_range._M_extent._M_extent_value._4_4_ =
           sub_ent_range._M_extent._M_extent_value._4_4_ + 1;
    }
    __gnu_cxx::
    __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void scanTopology(const lf::mesh::Mesh &mesh, dim_t codim) {
  LF_ASSERT_MSG((codim <= mesh.DimMesh()),
		"codim " << +codim << " too large");
  // loop over all entities of the specified codimension
  for (const lf::mesh::Entity* ent : mesh.Entities(codim)) {
    // Fetch topology type (TRIA or QUAD so far)
    const lf::base::RefEl ref_el{ent->RefEl()};
    // Print topological type and global index of the ent
    const glb_idx_t ent_idx = mesh.Index(*ent);
    std::cout << ref_el << ": idx = " << ent_idx << '\n';
    // Inspect sub-entities of any co-dimension
    for (dim_t sub_codim = 1; sub_codim <= mesh.DimMesh() - codim;
         ++sub_codim) {
      // Obtain iterator over sub-entities
      const std::span<const lf::mesh::Entity* const>
	sub_ent_range { ent->SubEntities(sub_codim) };
      size_type sub_cnt = 0;  // Counter for sub-entities
      // Loop over sub-entities, whose types and indices will be output
      for (const lf::mesh::Entity* subent : sub_ent_range) { // \Label[line]{st:1}
        std::cout << "\t rel. codim " << +sub_codim << " sub-ent "
		  << sub_cnt << ": " << *subent << ", idx = "
		  << mesh.Index(*subent) << '\n';
        sub_cnt++;
      }}}}